

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O2

TestResult * __thiscall JsonTest::TestResult::operator<<(TestResult *this,char (*value) [12])

{
  uint *puVar1;
  ostringstream oss;
  string local_1b0;
  long local_190;
  undefined8 local_188 [2];
  uint auStack_178 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x10;
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190 + -0x18));
  *puVar1 = *puVar1 | 0x104;
  std::operator<<((ostream *)&local_190,*value);
  std::__cxx11::stringbuf::str();
  addToLastFailure(this,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return this;
}

Assistant:

TestResult& operator<<(const T& value) {
    std::ostringstream oss;
    oss.precision(16);
    oss.setf(std::ios_base::floatfield);
    oss << value;
    return addToLastFailure(oss.str());
  }